

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int ZPdr_ManDown(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube,Pdr_Set_t *pPred,Hash_Int_t *keep,
                Pdr_Set_t *pIndCube,int *added)

{
  bool bVar1;
  FILE *pFile;
  Pdr_Set_t *p_00;
  int iVar2;
  int iVar3;
  Pdr_Set_t *pPVar4;
  Pdr_Set_t *pCtg;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t *pCubeTmp;
  int local_58;
  int kMax;
  int micResult;
  int l;
  int ctgAttempts;
  int i;
  int CtgRetValue;
  int RetValue;
  Pdr_Set_t *pIndCube_local;
  Hash_Int_t *keep_local;
  Pdr_Set_t *pPred_local;
  Pdr_Set_t **ppCube_local;
  Pdr_Man_t *pPStack_18;
  int k_local;
  Pdr_Man_t *p_local;
  
  i = 0;
  _CtgRetValue = pIndCube;
  pIndCube_local = (Pdr_Set_t *)keep;
  keep_local = (Hash_Int_t *)pPred;
  pPred_local = (Pdr_Set_t *)ppCube;
  ppCube_local._4_4_ = k;
  pPStack_18 = p;
  iVar2 = Vec_PtrSize(p->vSolvers);
  pCubeTmp._4_4_ = iVar2 + -1;
  do {
    if (i != 0) {
      return 1;
    }
    micResult = 0;
    while( true ) {
      bVar1 = false;
      if (((pPStack_18->pPars->fCtgs != 0) && (bVar1 = false, i == 0)) &&
         (bVar1 = false, 1 < ppCube_local._4_4_)) {
        bVar1 = micResult < 3;
      }
      if (!bVar1) goto LAB_00767397;
      pPVar4 = Pdr_SetDup((Pdr_Set_t *)keep_local);
      iVar2 = Pdr_SetIsInit(pPVar4,-1);
      if (iVar2 != 0) {
        Pdr_SetDeref(pPVar4);
        goto LAB_00767397;
      }
      if (*added == 0) {
        for (l = 1; l <= ppCube_local._4_4_; l = l + 1) {
          Pdr_ManSolverAddClause(pPStack_18,l,_CtgRetValue);
        }
        *added = 1;
      }
      micResult = micResult + 1;
      ctgAttempts = Pdr_ManCheckCube(pPStack_18,ppCube_local._4_4_ + -1,pPVar4,(Pdr_Set_t **)0x0,
                                     pPStack_18->pPars->nConfLimit,0,1);
      if (ctgAttempts != 1) break;
      pCtg = Pdr_ManReduceClause(pPStack_18,ppCube_local._4_4_ + -1,pPVar4);
      if (pCtg == (Pdr_Set_t *)0x0) {
        pCtg = Pdr_SetDup(pPVar4);
      }
      kMax = ppCube_local._4_4_;
      while ((kMax < pCubeTmp._4_4_ &&
             (iVar2 = Pdr_ManCheckCube(pPStack_18,kMax,pCtg,(Pdr_Set_t **)0x0,0,0,1), iVar2 != 0)))
      {
        kMax = kMax + 1;
      }
      local_58 = ZPdr_ManSimpleMic(pPStack_18,kMax + -1,&pCtg);
      if (local_58 == -1) {
        __assert_fail("micResult != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                      ,0x19c,
                      "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                     );
      }
      if (pPStack_18->pPars->fVeryVerbose != 0) {
        Abc_Print(1,"Adding cube ");
        p_00 = pCtg;
        pFile = _stdout;
        iVar2 = Aig_ManRegNum(pPStack_18->pAig);
        Pdr_SetPrint(pFile,p_00,iVar2,(Vec_Int_t *)0x0);
        Abc_Print(1," to frame %d.\n",(ulong)(uint)kMax);
      }
      for (l = 0; l < pCtg->nLits; l = l + 1) {
        if (*(int *)(&pCtg->field_0x14 + (long)l * 4) < 0) {
          __assert_fail("pCubeMin->Lits[i] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x1a8,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        iVar2 = *(int *)(&pCtg->field_0x14 + (long)l * 4);
        iVar3 = Aig_ManRegNum(pPStack_18->pAig);
        if (iVar3 <= iVar2 / 2) {
          __assert_fail("(pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x1a9,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        iVar2 = Vec_IntEntry(pPStack_18->vPrio,*(int *)(&pCtg->field_0x14 + (long)l * 4) / 2);
        if (iVar2 >> ((byte)pPStack_18->nPrioShift & 0x1f) == 0) {
          pPStack_18->nAbsFlops = pPStack_18->nAbsFlops + 1;
        }
        Vec_IntAddToEntry(pPStack_18->vPrio,*(int *)(&pCtg->field_0x14 + (long)l * 4) / 2,
                          1 << ((byte)pPStack_18->nPrioShift & 0x1f));
      }
      Vec_VecPush(pPStack_18->vClauses,kMax,pCtg);
      pPStack_18->nCubes = pPStack_18->nCubes + 1;
      for (l = 1; l <= kMax; l = l + 1) {
        Pdr_ManSolverAddClause(pPStack_18,l,pCtg);
      }
      Pdr_SetDeref((Pdr_Set_t *)keep_local);
      i = Pdr_ManCheckCube(pPStack_18,ppCube_local._4_4_,(Pdr_Set_t *)pPred_local->Sign,
                           (Pdr_Set_t **)&keep_local,pPStack_18->pPars->nConfLimit,0,1);
      if (i < 0) {
        __assert_fail("RetValue >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                      ,0x1b6,
                      "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                     );
      }
      Pdr_SetDeref(pPVar4);
      if (i == 1) {
        return 1;
      }
    }
    Pdr_SetDeref(pPVar4);
LAB_00767397:
    if (pPStack_18->pPars->fVeryVerbose != 0) {
      printf("Cube:\n");
      ZPdr_SetPrint((Pdr_Set_t *)pPred_local->Sign);
      printf("\nPred:\n");
      ZPdr_SetPrint((Pdr_Set_t *)keep_local);
    }
    pCubeMin = (Pdr_Set_t *)pPred_local->Sign;
    pPVar4 = ZPdr_SetIntersection(pCubeMin,(Pdr_Set_t *)keep_local,(Hash_Int_t *)pIndCube_local);
    pPred_local->Sign = (word)pPVar4;
    Pdr_SetDeref(pCubeMin);
    Pdr_SetDeref((Pdr_Set_t *)keep_local);
    if (pPred_local->Sign == 0) {
      return 0;
    }
    if (pPStack_18->pPars->fVeryVerbose != 0) {
      printf("Intersection:\n");
      ZPdr_SetPrint((Pdr_Set_t *)pPred_local->Sign);
    }
    iVar2 = Pdr_SetIsInit((Pdr_Set_t *)pPred_local->Sign,-1);
    if (iVar2 != 0) {
      if (pPStack_18->pPars->fVeryVerbose != 0) {
        printf("Failed initiation\n");
      }
      return 0;
    }
    i = Pdr_ManCheckCube(pPStack_18,ppCube_local._4_4_,(Pdr_Set_t *)pPred_local->Sign,
                         (Pdr_Set_t **)&keep_local,pPStack_18->pPars->nConfLimit,0,1);
    if (i == -1) {
      return -1;
    }
    if (i == 1) {
      return 1;
    }
    if ((i == 0) && (*(int *)(pPred_local->Sign + 0x10) == 1)) {
      Pdr_SetDeref((Pdr_Set_t *)keep_local);
      return 0;
    }
  } while( true );
}

Assistant:

int ZPdr_ManDown( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube, Pdr_Set_t * pPred, Hash_Int_t * keep, Pdr_Set_t * pIndCube, int * added )
{
    int RetValue = 0, CtgRetValue, i, ctgAttempts, l, micResult;
    int kMax = Vec_PtrSize(p->vSolvers)-1;
    Pdr_Set_t * pCubeTmp, * pCubeMin, * pCtg;
    while ( RetValue == 0 )
    {
        ctgAttempts = 0;
        while ( p->pPars->fCtgs && RetValue == 0 && k > 1 && ctgAttempts < 3 )
        {
            pCtg = Pdr_SetDup( pPred );
            //Check CTG for inductiveness
            if ( Pdr_SetIsInit( pCtg, -1 ) )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            if (*added == 0)
            {
                for ( i = 1; i <= k; i++ )
                    Pdr_ManSolverAddClause( p, i, pIndCube);
                *added = 1;
            }
            ctgAttempts++;
            CtgRetValue = Pdr_ManCheckCube( p, k-1, pCtg, NULL, p->pPars->nConfLimit, 0, 1 );
            if ( CtgRetValue != 1 )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            pCubeMin = Pdr_ManReduceClause( p, k-1, pCtg );
            if ( pCubeMin == NULL )
                pCubeMin = Pdr_SetDup ( pCtg );

            for ( l = k; l < kMax; l++ )
                if ( !Pdr_ManCheckCube( p, l, pCubeMin, NULL, 0, 0, 1 ) )
                    break;
            micResult = ZPdr_ManSimpleMic( p, l-1, &pCubeMin );
            assert ( micResult != -1 );

            // add new clause
            if ( p->pPars->fVeryVerbose )
            {
                Abc_Print( 1, "Adding cube " );
                Pdr_SetPrint( stdout, pCubeMin, Aig_ManRegNum(p->pAig), NULL );
                Abc_Print( 1, " to frame %d.\n", l );
            }
            // set priority flops
            for ( i = 0; i < pCubeMin->nLits; i++ )
            {
                assert( pCubeMin->Lits[i] >= 0 );
                assert( (pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig) );
                if ( (Vec_IntEntry(p->vPrio, pCubeMin->Lits[i] / 2) >> p->nPrioShift) == 0 )
                    p->nAbsFlops++;
                Vec_IntAddToEntry( p->vPrio, pCubeMin->Lits[i] / 2, 1 << p->nPrioShift );
            }

            Vec_VecPush( p->vClauses, l, pCubeMin );   // consume ref
            p->nCubes++;
            // add clause
            for ( i = 1; i <= l; i++ )
                Pdr_ManSolverAddClause( p, i, pCubeMin );
            Pdr_SetDeref( pPred );
            RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
            assert( RetValue >= 0 );
            Pdr_SetDeref( pCtg );
            if ( RetValue == 1 )
            {
                //printf ("IT'S A ONE\n");
                return 1;
            }
        }

        //join
        if ( p->pPars->fVeryVerbose )
        {
            printf("Cube:\n");
            ZPdr_SetPrint( *ppCube );
            printf("\nPred:\n");
            ZPdr_SetPrint( pPred );
        }
        *ppCube = ZPdr_SetIntersection( pCubeTmp = *ppCube, pPred, keep );
        Pdr_SetDeref( pCubeTmp );
        Pdr_SetDeref( pPred );
        if ( *ppCube == NULL )
            return 0;
        if ( p->pPars->fVeryVerbose )
        {
            printf("Intersection:\n");
            ZPdr_SetPrint( *ppCube );
        }
        if ( Pdr_SetIsInit( *ppCube, -1 ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf ("Failed initiation\n");
            return 0;
        }
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        if ( RetValue == 1 )
        {
            //printf ("*********IT'S A ONE\n");
            break;
        }
        if ( RetValue == 0 && (*ppCube)->nLits == 1)
        {
            Pdr_SetDeref( pPred ); // fixed memory leak
            // A workaround for the incomplete assignment returned by the SAT
            // solver
            return 0;
        }
    }
    return 1;
}